

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

RefPtr<wabt::interp::Table> * __thiscall
wabt::interp::Store::Alloc<wabt::interp::Table,wabt::interp::Store&,wabt::interp::TableType&>
          (RefPtr<wabt::interp::Table> *__return_storage_ptr__,Store *this,Store *args,
          TableType *args_1)

{
  undefined8 uVar1;
  Table *this_00;
  Ref ref;
  Table *local_60;
  TableType local_58;
  
  this_00 = (Table *)operator_new(0x80);
  local_58.super_ExternType.kind = (args_1->super_ExternType).kind;
  local_58.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002e7b80;
  local_58.limits._12_6_ = SUB86((ulong)*(undefined8 *)((long)&(args_1->limits).max + 2) >> 0x10,0);
  local_58._12_8_ = *(undefined8 *)&(args_1->super_ExternType).field_0xc;
  uVar1 = *(undefined8 *)((long)&(args_1->limits).initial + 4);
  local_58.limits._4_6_ = SUB86(uVar1,0);
  local_58.limits.max._2_2_ = (undefined2)((ulong)uVar1 >> 0x30);
  Table::Table(this_00,args,&local_58);
  local_60 = this_00;
  ref.index = FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
              ::New<wabt::interp::Table*>
                        ((FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
                          *)&this->objects_,&local_60);
  RefPtr<wabt::interp::Table>::RefPtr(__return_storage_ptr__,this,ref);
  (__return_storage_ptr__->obj_->super_Extern).super_Object.self_.index = ref.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}